

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkItem>
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libs)

{
  string *linkLanguage;
  pointer pcVar1;
  cmGeneratorTarget *this_00;
  cmake *pcVar2;
  pointer pcVar3;
  pointer pLVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  pointer piVar7;
  __type _Var8;
  bool bVar9;
  TargetType TVar10;
  ulong uVar11;
  string *psVar12;
  string *psVar13;
  pair<int,_bool> pVar14;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  _Base_ptr p_Var16;
  undefined7 extraout_var;
  _Rb_tree_node_base *p_Var17;
  _Base_ptr p_Var18;
  pointer this_01;
  pointer pLVar19;
  int iVar20;
  long lVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer piVar22;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view prefix_02;
  char local_2aa [2];
  cmLinkItem *local_2a8;
  pair<int,_bool> groupIndex;
  int dependee_index;
  int local_294;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  allocator<char> local_282;
  allocator<char> local_281;
  string *local_280;
  vector<int,_std::allocator<int>_> indexes;
  int index;
  undefined4 uStack_234;
  char *local_230;
  cmAlphaNum local_208;
  undefined1 local_1d0 [72];
  string feature;
  vector<int,_std::allocator<int>_> groupItems;
  cmAlphaNum local_130;
  undefined1 local_100 [16];
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  string local_c0;
  string local_a0;
  cmAlphaNum local_80;
  string local_50;
  
  dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &dependSets._M_t._M_impl.super__Rb_tree_header._M_header;
  dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  dependSets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&feature,(string *)&LinkEntry::DEFAULT_abi_cxx11_);
  groupIndex.first = -1;
  groupIndex.second = false;
  groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_01 = (libs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pcVar1 = (libs->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar11 = (ulong)(uint)depender_index;
  linkLanguage = &this->LinkLanguage;
  local_1d0._48_8_ = &this->OriginalEntries;
  local_1d0._64_8_ = &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header;
  bVar6 = false;
  local_294 = depender_index;
  local_1d0._56_8_ = uVar11;
  do {
    p_Var17 = dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (this_01 == pcVar1) {
      for (; (_Rb_tree_header *)p_Var17 != &dependSets._M_t._M_impl.super__Rb_tree_header;
          p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
        std::
        vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
        push_back(&(this->InferredDependSets).
                   super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)p_Var17[1]._M_color].
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                  ,(value_type *)&p_Var17[1]._M_parent);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&groupItems.super__Vector_base<int,_std::allocator<int>_>);
      std::__cxx11::string::~string((string *)&feature);
      std::
      _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
      ::~_Rb_tree(&dependSets._M_t);
      return;
    }
    local_2a8 = this_01;
    psVar12 = cmLinkItem::AsStr_abi_cxx11_(this_01);
    psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    _Var8 = std::operator==(psVar12,psVar13);
    if ((!_Var8) &&
       (psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8), psVar12->_M_string_length != 0)) {
      psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
      str._M_str = (psVar12->_M_dataplus)._M_p;
      str._M_len = psVar12->_M_string_length;
      prefix._M_str = DAT_007eaf80;
      prefix._M_len = (anonymous_namespace)::LL_BEGIN;
      bVar9 = cmHasPrefix(str,prefix);
      if (bVar9) {
        psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
        if ((psVar12->_M_string_length != 0) &&
           ((psVar12->_M_dataplus)._M_p[psVar12->_M_string_length - 1] == '>')) {
          psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
          anon_unknown.dwarf_16cef30::ExtractFeature((string *)&indexes,psVar12);
          std::__cxx11::string::operator=((string *)&feature,(string *)&indexes);
          std::__cxx11::string::~string((string *)&indexes);
          if (-1 < local_294) {
            pLVar19 = (this->EntryList).
                      super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            this_00 = pLVar19[uVar11].Target;
            if (((this_00 != (cmGeneratorTarget *)0x0) &&
                (bVar9 = cmGeneratorTarget::IsImported(this_00), bVar9)) &&
               (bVar9 = anon_unknown.dwarf_16cef30::IsFeatureSupported
                                  (this->Makefile,linkLanguage,&feature), !bVar9)) {
              pcVar2 = this->CMakeInstance;
              indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x17;
              indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)anon_var_dwarf_16d231b;
              psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(pLVar19[uVar11].Target);
              local_208.View_._M_str = (psVar12->_M_dataplus)._M_p;
              local_208.View_._M_len = psVar12->_M_string_length;
              cmStrCat<char[69],std::__cxx11::string,char[93],std::__cxx11::string,char[21],std::__cxx11::string,char[14],std::__cxx11::string,char[21],std::__cxx11::string,char[13]>
                        ((string *)&index,(cmAlphaNum *)&indexes,&local_208,
                         (char (*) [69])
                         "\' uses the generator-expression \'$<LINK_LIBRARY>\' with the feature \'",
                         &feature,(char (*) [93])
                                  "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
                         ,linkLanguage,(char (*) [21])0x5e5197,&feature,
                         (char (*) [14])"\" and \"CMAKE_",linkLanguage,(char (*) [21])0x5e5197,
                         &feature,(char (*) [13])"_SUPPORTED\"?");
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d0);
              cmake::IssueMessage(pcVar2,AUTHOR_ERROR,(string *)&index,
                                  (cmListFileBacktrace *)local_1d0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
              std::__cxx11::string::~string((string *)&index);
            }
          }
          goto LAB_003fc7f0;
        }
      }
      psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
      str_00._M_str = (psVar12->_M_dataplus)._M_p;
      str_00._M_len = psVar12->_M_string_length;
      prefix_00._M_str = DAT_007eaf90;
      prefix_00._M_len = (anonymous_namespace)::LL_END;
      bVar9 = cmHasPrefix(str_00,prefix_00);
      if (bVar9) {
        psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
        if ((psVar12->_M_string_length != 0) &&
           ((psVar12->_M_dataplus)._M_p[psVar12->_M_string_length - 1] == '>')) {
          std::__cxx11::string::_M_assign((string *)&feature);
          goto LAB_003fc7f0;
        }
      }
      psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
      str_01._M_str = (psVar12->_M_dataplus)._M_p;
      str_01._M_len = psVar12->_M_string_length;
      prefix_01._M_str = DAT_007eafa0;
      prefix_01._M_len = (anonymous_namespace)::LG_BEGIN;
      bVar9 = cmHasPrefix(str_01,prefix_01);
      if (bVar9) {
        psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
        if ((psVar12->_M_string_length != 0) &&
           ((psVar12->_M_dataplus)._M_p[psVar12->_M_string_length - 1] == '>')) {
          pVar14 = AddLinkEntry(this,local_2a8,-1);
          iVar20 = pVar14.first;
          groupIndex.second = pVar14.second;
          groupIndex.first = iVar20;
          if (((ulong)pVar14 >> 0x20 & 1) != 0) {
            pLVar19 = (this->EntryList).
                      super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
            anon_unknown.dwarf_16cef30::ExtractGroupFeature((string *)&indexes,psVar12);
            std::__cxx11::string::operator=((string *)&pLVar19[iVar20].Feature,(string *)&indexes);
            std::__cxx11::string::~string((string *)&indexes);
          }
          if (local_294 < 0) {
            bVar6 = true;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_1d0._48_8_,&groupIndex.first);
          }
          else {
            pcVar3 = (this->EntryConstraintGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_208.View_._M_len = local_208.View_._M_len & 0xffffffffffffff00;
            _index = _index & 0xffffffffffffff00;
            indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&indexes);
            std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
            emplace_back<int&,bool,bool,cmListFileBacktrace>
                      ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                       (pcVar3 + local_1d0._56_8_),&groupIndex.first,(bool *)&local_208,
                       (bool *)&index,(cmListFileBacktrace *)&indexes);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
            bVar6 = true;
          }
          goto LAB_003fc7f0;
        }
      }
      psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
      str_02._M_str = (psVar12->_M_dataplus)._M_p;
      str_02._M_len = psVar12->_M_string_length;
      prefix_02._M_str = DAT_007eafb0;
      prefix_02._M_len = (anonymous_namespace)::LG_END;
      bVar9 = cmHasPrefix(str_02,prefix_02);
      if (bVar9) {
        psVar12 = cmLinkItem::AsStr_abi_cxx11_(local_2a8);
        if ((psVar12->_M_string_length != 0) &&
           ((psVar12->_M_dataplus)._M_p[psVar12->_M_string_length - 1] == '>')) {
          dependee_index = groupIndex.first;
          if (groupIndex.second == true) {
            std::
            _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
            ::_M_emplace_unique<int&,std::vector<int,std::allocator<int>>&>
                      ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                        *)&this->GroupItems,&groupIndex.first,&groupItems);
          }
          groupIndex.first = -1;
          groupIndex.second = false;
          if (groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = groupItems.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          bVar6 = false;
          goto LAB_003fc7f0;
        }
      }
      if ((-1 < local_294) && (bVar6)) {
        pLVar19 = (this->EntryList).
                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pLVar19[uVar11].Target != (cmGeneratorTarget *)0x0) {
          lVar21 = (long)groupIndex.first;
          bVar9 = cmGeneratorTarget::IsImported(pLVar19[uVar11].Target);
          if (bVar9) {
            psVar12 = &pLVar19[lVar21].Feature;
            bVar9 = anon_unknown.dwarf_16cef30::IsGroupFeatureSupported
                              (this->Makefile,linkLanguage,psVar12);
            if (!bVar9) {
              pcVar2 = this->CMakeInstance;
              indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x17;
              indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)anon_var_dwarf_16d231b;
              psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(pLVar19[uVar11].Target);
              local_208.View_._M_str = (psVar13->_M_dataplus)._M_p;
              local_208.View_._M_len = psVar13->_M_string_length;
              cmStrCat<char[67],std::__cxx11::string,char[93],std::__cxx11::string,char[19],std::__cxx11::string,char[14],std::__cxx11::string,char[19],std::__cxx11::string,char[13]>
                        ((string *)&index,(cmAlphaNum *)&indexes,&local_208,
                         (char (*) [67])
                         "\' uses the generator-expression \'$<LINK_GROUP>\' with the feature \'",
                         psVar12,(char (*) [93])
                                 "\', which is undefined or unsupported.\nDid you miss to define it by setting variables \"CMAKE_"
                         ,linkLanguage,(char (*) [19])0x5e5460,psVar12,
                         (char (*) [14])"\" and \"CMAKE_",linkLanguage,(char (*) [19])0x5e5460,
                         psVar12,(char (*) [13])"_SUPPORTED\"?");
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d0);
              cmake::IssueMessage(pcVar2,AUTHOR_ERROR,(string *)&index,
                                  (cmListFileBacktrace *)local_1d0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
              std::__cxx11::string::~string((string *)&index);
            }
          }
        }
      }
      pVar14 = AddLinkEntry(this,local_2a8,groupIndex.first);
      dependee_index = pVar14.first;
      pLVar19 = (this->EntryList).
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                ._M_impl.super__Vector_impl_data._M_start + dependee_index;
      psVar12 = GetCurrentFeature(this,(string *)pLVar19,&feature);
      local_280 = psVar12;
      if (((((ulong)pVar14 >> 0x20 & 1) != 0 && !(bool)~bVar6) &&
          (pLVar19->Target != (cmGeneratorTarget *)0x0)) &&
         ((TVar10 = cmGeneratorTarget::GetType(pLVar19->Target), TVar10 == OBJECT_LIBRARY ||
          (TVar10 = cmGeneratorTarget::GetType(pLVar19->Target), TVar10 == INTERFACE_LIBRARY)))) {
        lVar21 = (long)groupIndex.first;
        pcVar2 = this->CMakeInstance;
        pLVar4 = (this->EntryList).
                 super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0xd;
        indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)anon_var_dwarf_16d23c1;
        local_208.View_._M_str = pLVar4[lVar21].Feature._M_dataplus._M_p;
        local_208.View_._M_len = pLVar4[lVar21].Feature._M_string_length;
        TVar10 = cmGeneratorTarget::GetType(pLVar19->Target);
        local_130.View_._M_len = 0x5e8b7e;
        if (TVar10 == OBJECT_LIBRARY) {
          local_130.View_._M_len = 0x5e0fa8;
        }
        cmStrCat<char[50],cm::static_string_view,std::__cxx11::string,char[32],char_const*,char[11],std::__cxx11::string,char[3]>
                  ((string *)&index,(cmAlphaNum *)&indexes,&local_208,
                   (char (*) [50])"\', specified as part of a generator-expression \'$",
                   (static_string_view *)&(anonymous_namespace)::LG_BEGIN,&pLVar4[lVar21].Feature,
                   (char (*) [32])">\', will not be applied to the ",(char **)&local_130,
                   (char (*) [11])" library \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pLVar19,
                   (char (*) [3])0x5c488f);
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d0);
        cmake::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)&index,(cmListFileBacktrace *)local_1d0)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
        std::__cxx11::string::~string((string *)&index);
        psVar12 = local_280;
      }
      bVar9 = std::operator!=(psVar12,&LinkEntry::DEFAULT_abi_cxx11_);
      if (bVar9 && ((ulong)pVar14 >> 0x20 & 1) != 0) {
        if ((pLVar19->Target == (cmGeneratorTarget *)0x0) ||
           ((TVar10 = cmGeneratorTarget::GetType(pLVar19->Target), TVar10 != OBJECT_LIBRARY &&
            (TVar10 = cmGeneratorTarget::GetType(pLVar19->Target), TVar10 != INTERFACE_LIBRARY)))) {
          std::__cxx11::string::_M_assign((string *)&pLVar19->Feature);
        }
        else {
          pcVar2 = this->CMakeInstance;
          indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0xd;
          indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)anon_var_dwarf_16d23c1;
          local_208.View_._M_len = feature._M_string_length;
          local_208.View_._M_str = feature._M_dataplus._M_p;
          TVar10 = cmGeneratorTarget::GetType(pLVar19->Target);
          local_130.View_._M_len = 0x5e8b7e;
          if (TVar10 == OBJECT_LIBRARY) {
            local_130.View_._M_len = 0x5e0fa8;
          }
          cmStrCat<char[50],cm::static_string_view,std::__cxx11::string,char[32],char_const*,char[11],std::__cxx11::string,char[3]>
                    ((string *)&index,(cmAlphaNum *)&indexes,&local_208,
                     (char (*) [50])"\', specified as part of a generator-expression \'$",
                     (static_string_view *)&(anonymous_namespace)::LL_BEGIN,&feature,
                     (char (*) [32])">\', will not be applied to the ",(char **)&local_130,
                     (char (*) [11])" library \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pLVar19,
                     (char (*) [3])0x5c488f);
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d0);
          cmake::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)&index,
                              (cmListFileBacktrace *)local_1d0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
          std::__cxx11::string::~string((string *)&index);
        }
      }
      if ((pLVar19->Target == (cmGeneratorTarget *)0x0) ||
         ((TVar10 = cmGeneratorTarget::GetType(pLVar19->Target), TVar10 != OBJECT_LIBRARY &&
          (TVar10 = cmGeneratorTarget::GetType(pLVar19->Target), TVar10 != INTERFACE_LIBRARY)))) {
        if (bVar6) {
          __rhs = &(this->EntryList).
                   super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start[groupIndex.first].Feature;
          local_290 = __rhs;
          for (p_Var16 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var16 != (_Base_ptr)local_1d0._64_8_;
              p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
            psVar12 = &(this->EntryList).
                       super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)p_Var16[1]._M_color].Feature;
            _Var8 = std::operator==(psVar12,__rhs);
            if ((!_Var8) &&
               (_Var15 = std::
                         __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                   (p_Var16[1]._M_parent,p_Var16[1]._M_left,&dependee_index),
               (_Base_ptr)_Var15._M_current != p_Var16[1]._M_left)) {
              pcVar2 = this->CMakeInstance;
              indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)&DAT_0000001b;
              indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)anon_var_dwarf_16d243f;
              psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
              local_208.View_._M_str = (psVar13->_M_dataplus)._M_p;
              local_208.View_._M_len = psVar13->_M_string_length;
              local_130.View_._M_len = CONCAT71(local_130.View_._M_len._1_7_,0x27);
              local_80.View_._M_len = CONCAT71(local_80.View_._M_len._1_7_,0x27);
              cmStrCat<char[26],std::__cxx11::string,char[38],std::__cxx11::string,char,char[42],std::__cxx11::string,char,char[24]>
                        ((string *)&index,(cmAlphaNum *)&indexes,&local_208,
                         (char (*) [26])"\' because the link item \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pLVar19,(char (*) [38])"\', specified with the group feature \'",local_290,
                         (char *)&local_130,
                         (char (*) [42])", has already occurred with the feature \'",psVar12,
                         (char *)&local_80,(char (*) [24])", which is not allowed.");
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d0);
              cmake::IssueMessage(pcVar2,FATAL_ERROR,(string *)&index,
                                  (cmListFileBacktrace *)local_1d0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
              std::__cxx11::string::~string((string *)&index);
              __rhs = local_290;
            }
          }
        }
        bVar9 = std::operator!=(&pLVar19->Feature,local_280);
        if (bVar9) {
          pcVar2 = this->CMakeInstance;
          indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&DAT_0000001b;
          indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)anon_var_dwarf_16d243f;
          psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          psVar12 = local_280;
          local_208.View_._M_str = (psVar13->_M_dataplus)._M_p;
          local_208.View_._M_len = psVar13->_M_string_length;
          _Var8 = std::operator==(local_280,&LinkEntry::DEFAULT_abi_cxx11_);
          local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT71(local_290._1_7_,_Var8);
          if (_Var8) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"without any feature or \'DEFAULT\' feature",&local_281);
          }
          else {
            _index = (pointer)0x12;
            local_230 = "with the feature \'";
            local_1d0._8_8_ = (psVar12->_M_dataplus)._M_p;
            local_1d0._0_8_ = psVar12->_M_string_length;
            local_2aa[1] = 0x27;
            cmStrCat<char>(&local_c0,(cmAlphaNum *)&index,(cmAlphaNum *)local_1d0,local_2aa + 1);
          }
          _Var8 = std::operator==(&pLVar19->Feature,&LinkEntry::DEFAULT_abi_cxx11_);
          local_280 = (string *)CONCAT71(local_280._1_7_,_Var8);
          if (_Var8) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a0,"without any feature or \'DEFAULT\' feature",&local_282);
          }
          else {
            local_130.View_._M_len = 0x12;
            local_130.View_._M_str = "with the feature \'";
            local_80.View_._M_str = (pLVar19->Feature)._M_dataplus._M_p;
            local_80.View_._M_len = (pLVar19->Feature)._M_string_length;
            local_2aa[0] = '\'';
            cmStrCat<char>(&local_a0,&local_130,&local_80,local_2aa);
          }
          cmStrCat<char[26],std::__cxx11::string,char[14],std::__cxx11::string,char[24],std::__cxx11::string,char[24]>
                    (&local_50,(cmAlphaNum *)&indexes,&local_208,
                     (char (*) [26])"\' because the link item \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pLVar19,
                     (char (*) [14])"\', specified ",&local_c0,
                     (char (*) [24])", has already occurred ",&local_a0,
                     (char (*) [24])", which is not allowed.");
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_100);
          cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_50,(cmListFileBacktrace *)local_100);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
      if (bVar6) {
        std::vector<int,_std::allocator<int>_>::push_back(&groupItems,&dependee_index);
      }
      else {
        indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        p_Var16 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((ulong)local_290 & 0xffffffff00000000);
        for (; p_Var16 != (_Base_ptr)local_1d0._64_8_;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          p_Var18 = p_Var16[1]._M_parent;
          p_Var5 = p_Var16[1]._M_left;
          do {
            if (p_Var18 == p_Var5) goto LAB_003fc66c;
            _Var8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pLVar19,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((this->EntryList).
                                        super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                       (int)p_Var18->_M_color));
            p_Var18 = (_Base_ptr)&p_Var18->field_0x4;
          } while (!_Var8);
          local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(local_290._4_4_,(int)CONCAT71(extraout_var,1));
          std::vector<int,_std::allocator<int>_>::push_back
                    (&indexes,(value_type_conflict1 *)(p_Var16 + 1));
LAB_003fc66c:
        }
        if (((ulong)local_290 & 1) == 0) {
          std::vector<int,_std::allocator<int>_>::push_back(&indexes,&dependee_index);
        }
        piVar7 = indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar22 = indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar22 != piVar7; piVar22 = piVar22 + 1) {
          index = *piVar22;
          if (local_294 < 0) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_1d0._48_8_,&index);
            p_Var17 = dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          else {
            pcVar3 = (this->EntryConstraintGraph).
                     super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffffffffff00;
            local_130.View_._M_len = local_130.View_._M_len & 0xffffffffffffff00;
            local_208.View_._M_len = 0;
            local_208.View_._M_str = (pointer)0x0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_208);
            std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
            emplace_back<int&,bool,bool,cmListFileBacktrace>
                      ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                       (pcVar3 + local_1d0._56_8_),&index,(bool *)local_1d0,(bool *)&local_130,
                       (cmListFileBacktrace *)&local_208);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_208.View_._M_str);
            p_Var17 = dependSets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          for (; (_Rb_tree_header *)p_Var17 != &dependSets._M_t._M_impl.super__Rb_tree_header;
              p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
            pLVar19 = (this->EntryList).
                      super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (((pLVar19[index].Target == (cmGeneratorTarget *)0x0) &&
                (1 < pLVar19[index].Kind - Flag)) && (dependee_index != p_Var17[1]._M_color)) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&p_Var17[1]._M_parent,&index);
            }
          }
          if ((this->InferredDependSets).
              super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
              ._M_impl.super__Vector_impl_data._M_start[index].Initialized != false) {
            std::
            map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
            ::operator[](&dependSets,&index);
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&indexes.super__Vector_base<int,_std::allocator<int>_>);
      }
    }
LAB_003fc7f0:
    this_01 = local_2a8 + 1;
  } while( true );
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(int depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<int, DependSet> dependSets;
  std::string feature = LinkEntry::DEFAULT;

  bool inGroup = false;
  std::pair<int, bool> groupIndex{ -1, false };
  std::vector<int> groupItems;

  // Loop over the libraries linked directly by the depender.
  for (T const& l : libs) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = l;
    if (item.AsStr() == this->Target->GetName() || item.AsStr().empty()) {
      continue;
    }

    if (cmHasPrefix(item.AsStr(), LL_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      feature = ExtractFeature(item.AsStr());
      // emit a warning if an undefined feature is used as part of
      // an imported target
      if (depender_index >= 0) {
        const auto& depender = this->EntryList[depender_index];
        if (depender.Target != nullptr && depender.Target->IsImported() &&
            !IsFeatureSupported(this->Makefile, this->LinkLanguage, feature)) {
          this->CMakeInstance->IssueMessage(
            MessageType::AUTHOR_ERROR,
            cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                     "' uses the generator-expression '$<LINK_LIBRARY>' with "
                     "the feature '",
                     feature,
                     "', which is undefined or unsupported.\nDid you miss to "
                     "define it by setting variables \"CMAKE_",
                     this->LinkLanguage, "_LINK_LIBRARY_USING_", feature,
                     "\" and \"CMAKE_", this->LinkLanguage,
                     "_LINK_LIBRARY_USING_", feature, "_SUPPORTED\"?"),
            this->Target->GetBacktrace());
        }
      }
      continue;
    }
    if (cmHasPrefix(item.AsStr(), LL_END) && cmHasSuffix(item.AsStr(), '>')) {
      feature = LinkEntry::DEFAULT;
      continue;
    }

    if (cmHasPrefix(item.AsStr(), LG_BEGIN) &&
        cmHasSuffix(item.AsStr(), '>')) {
      groupIndex = this->AddLinkEntry(item);
      if (groupIndex.second) {
        LinkEntry& entry = this->EntryList[groupIndex.first];
        entry.Feature = ExtractGroupFeature(item.AsStr());
      }
      inGroup = true;
      if (depender_index >= 0) {
        this->EntryConstraintGraph[depender_index].emplace_back(
          groupIndex.first, false, false, cmListFileBacktrace());
      } else {
        // This is a direct dependency of the target being linked.
        this->OriginalEntries.push_back(groupIndex.first);
      }
      continue;
    }

    int dependee_index;

    if (cmHasPrefix(item.AsStr(), LG_END) && cmHasSuffix(item.AsStr(), '>')) {
      dependee_index = groupIndex.first;
      if (groupIndex.second) {
        this->GroupItems.emplace(groupIndex.first, groupItems);
      }
      inGroup = false;
      groupIndex = std::make_pair(-1, false);
      groupItems.clear();
      continue;
    }

    if (depender_index >= 0 && inGroup) {
      const auto& depender = this->EntryList[depender_index];
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      if (depender.Target != nullptr && depender.Target->IsImported() &&
          !IsGroupFeatureSupported(this->Makefile, this->LinkLanguage,
                                   groupFeature)) {
        this->CMakeInstance->IssueMessage(
          MessageType::AUTHOR_ERROR,
          cmStrCat("The 'IMPORTED' target '", depender.Target->GetName(),
                   "' uses the generator-expression '$<LINK_GROUP>' with "
                   "the feature '",
                   groupFeature,
                   "', which is undefined or unsupported.\nDid you miss to "
                   "define it by setting variables \"CMAKE_",
                   this->LinkLanguage, "_LINK_GROUP_USING_", groupFeature,
                   "\" and \"CMAKE_", this->LinkLanguage, "_LINK_GROUP_USING_",
                   groupFeature, "_SUPPORTED\"?"),
          this->Target->GetBacktrace());
      }
    }

    // Add a link entry for this item.
    auto ale = this->AddLinkEntry(item, groupIndex.first);
    dependee_index = ale.first;
    LinkEntry& entry = this->EntryList[dependee_index];
    auto const& itemFeature =
      this->GetCurrentFeature(entry.Item.Value, feature);
    if (inGroup && ale.second && entry.Target != nullptr &&
        (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY ||
         entry.Target->GetType() ==
           cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
      const auto& groupFeature = this->EntryList[groupIndex.first].Feature;
      this->CMakeInstance->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmStrCat(
          "The feature '", groupFeature,
          "', specified as part of a generator-expression "
          "'$",
          LG_BEGIN, groupFeature, ">', will not be applied to the ",
          (entry.Target->GetType() == cmStateEnums::TargetType::OBJECT_LIBRARY
             ? "OBJECT"
             : "INTERFACE"),
          " library '", entry.Item.Value, "'."),
        this->Target->GetBacktrace());
    }
    if (itemFeature != LinkEntry::DEFAULT) {
      if (ale.second) {
        // current item not yet defined
        if (entry.Target != nullptr &&
            (entry.Target->GetType() ==
               cmStateEnums::TargetType::OBJECT_LIBRARY ||
             entry.Target->GetType() ==
               cmStateEnums::TargetType::INTERFACE_LIBRARY)) {
          this->CMakeInstance->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmStrCat("The feature '", feature,
                     "', specified as part of a generator-expression "
                     "'$",
                     LL_BEGIN, feature, ">', will not be applied to the ",
                     (entry.Target->GetType() ==
                          cmStateEnums::TargetType::OBJECT_LIBRARY
                        ? "OBJECT"
                        : "INTERFACE"),
                     " library '", entry.Item.Value, "'."),
            this->Target->GetBacktrace());
        } else {
          entry.Feature = itemFeature;
        }
      }
    }

    bool supportedItem = entry.Target == nullptr ||
      (entry.Target->GetType() != cmStateEnums::TargetType::OBJECT_LIBRARY &&
       entry.Target->GetType() != cmStateEnums::TargetType::INTERFACE_LIBRARY);

    if (supportedItem) {
      if (inGroup) {
        const auto& currentFeature = this->EntryList[groupIndex.first].Feature;
        for (const auto& g : this->GroupItems) {
          const auto& groupFeature = this->EntryList[g.first].Feature;
          if (groupFeature == currentFeature) {
            continue;
          }
          if (std::find(g.second.cbegin(), g.second.cend(), dependee_index) !=
              g.second.cend()) {
            this->CMakeInstance->IssueMessage(
              MessageType::FATAL_ERROR,
              cmStrCat("Impossible to link target '", this->Target->GetName(),
                       "' because the link item '", entry.Item.Value,
                       "', specified with the group feature '", currentFeature,
                       '\'', ", has already occurred with the feature '",
                       groupFeature, '\'', ", which is not allowed."),
              this->Target->GetBacktrace());
            continue;
          }
        }
      }
      if (entry.Feature != itemFeature) {
        // incompatibles features occurred
        this->CMakeInstance->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Impossible to link target '", this->Target->GetName(),
                   "' because the link item '", entry.Item.Value,
                   "', specified ",
                   (itemFeature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", itemFeature, '\'')),
                   ", has already occurred ",
                   (entry.Feature == LinkEntry::DEFAULT
                      ? "without any feature or 'DEFAULT' feature"
                      : cmStrCat("with the feature '", entry.Feature, '\'')),
                   ", which is not allowed."),
          this->Target->GetBacktrace());
      }
    }

    if (inGroup) {
      // store item index for dependencies handling
      groupItems.push_back(dependee_index);
    } else {
      std::vector<int> indexes;
      bool entryHandled = false;
      // search any occurrence of the library in already defined groups
      for (const auto& group : this->GroupItems) {
        for (auto index : group.second) {
          if (entry.Item.Value == this->EntryList[index].Item.Value) {
            indexes.push_back(group.first);
            entryHandled = true;
            break;
          }
        }
      }
      if (!entryHandled) {
        indexes.push_back(dependee_index);
      }

      for (auto index : indexes) {
        // The dependee must come after the depender.
        if (depender_index >= 0) {
          this->EntryConstraintGraph[depender_index].emplace_back(
            index, false, false, cmListFileBacktrace());
        } else {
          // This is a direct dependency of the target being linked.
          this->OriginalEntries.push_back(index);
        }

        // Update the inferred dependencies for earlier items.
        for (auto& dependSet : dependSets) {
          // Add this item to the inferred dependencies of other items.
          // Target items are never inferred dependees because unknown
          // items are outside libraries that should not be depending on
          // targets.
          if (!this->EntryList[index].Target &&
              this->EntryList[index].Kind != LinkEntry::Flag &&
              this->EntryList[index].Kind != LinkEntry::Group &&
              dependee_index != dependSet.first) {
            dependSet.second.insert(index);
          }
        }

        // If this item needs to have dependencies inferred, do so.
        if (this->InferredDependSets[index].Initialized) {
          // Make sure an entry exists to hold the set for the item.
          dependSets[index];
        }
      }
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (auto const& dependSet : dependSets) {
    this->InferredDependSets[dependSet.first].push_back(dependSet.second);
  }
}